

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_enum_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::RepeatedEnumFieldGenerator::GenerateSerializeWithCachedSizesToArray
          (RepeatedEnumFieldGenerator *this,Printer *printer)

{
  char *text;
  
  if (*(char *)(*(long *)(this->descriptor_ + 0x60) + 0x44) == '\x01') {
    io::Printer::Print(printer,&this->variables_,
                       "if (this->$name$_size() > 0) {\n  target = ::google::protobuf::internal::WireFormatLite::WriteTagToArray(\n    $number$,\n    ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED,\n    target);\n  target = ::google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(    _$name$_cached_byte_size_, target);\n}\n"
                      );
  }
  io::Printer::Print(printer,&this->variables_,"for (int i = 0; i < this->$name$_size(); i++) {\n");
  text = 
  "  target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(\n    $number$, this->$name$(i), target);\n"
  ;
  if (*(char *)(*(long *)(this->descriptor_ + 0x60) + 0x44) != '\0') {
    text = 
    "  target = ::google::protobuf::internal::WireFormatLite::WriteEnumNoTagToArray(\n    this->$name$(i), target);\n"
    ;
  }
  io::Printer::Print(printer,&this->variables_,text);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void RepeatedEnumFieldGenerator::
GenerateSerializeWithCachedSizesToArray(io::Printer* printer) const {
  if (descriptor_->options().packed()) {
    // Write the tag and the size.
    printer->Print(variables_,
      "if (this->$name$_size() > 0) {\n"
      "  target = ::google::protobuf::internal::WireFormatLite::WriteTagToArray(\n"
      "    $number$,\n"
      "    ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED,\n"
      "    target);\n"
      "  target = ::google::protobuf::io::CodedOutputStream::WriteVarint32ToArray("
      "    _$name$_cached_byte_size_, target);\n"
      "}\n");
  }
  printer->Print(variables_,
      "for (int i = 0; i < this->$name$_size(); i++) {\n");
  if (descriptor_->options().packed()) {
    printer->Print(variables_,
      "  target = ::google::protobuf::internal::WireFormatLite::WriteEnumNoTagToArray(\n"
      "    this->$name$(i), target);\n");
  } else {
    printer->Print(variables_,
      "  target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(\n"
      "    $number$, this->$name$(i), target);\n");
  }
  printer->Print("}\n");
}